

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledRgbaOutputFile::ToYa::ToYa
          (ToYa *this,TiledOutputFile *outputFile,RgbaChannels rgbaChannels)

{
  uint uVar1;
  uint uVar2;
  Rgba *pRVar3;
  Header *pHVar4;
  TileDescription *pTVar5;
  ulong uVar6;
  Rgba *pRVar7;
  undefined8 local_30;
  float local_28;
  
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_outputFile = outputFile;
  (this->_buf)._sizeX = 0;
  (this->_buf)._sizeY = 0;
  (this->_buf)._data = (Rgba *)0x0;
  this->_writeA = (bool)((byte)(rgbaChannels >> 3) & 1);
  pHVar4 = TiledOutputFile::header(outputFile);
  pTVar5 = Header::tileDescription(pHVar4);
  uVar1 = pTVar5->ySize;
  this->_tileXSize = pTVar5->xSize;
  this->_tileYSize = uVar1;
  pHVar4 = TiledOutputFile::header(this->_outputFile);
  anon_unknown_22::ywFromHeader((anon_unknown_22 *)&local_30,pHVar4);
  (this->_yw).x = (float)(undefined4)local_30;
  (this->_yw).y = (float)local_30._4_4_;
  (this->_yw).z = local_28;
  uVar1 = this->_tileXSize;
  uVar2 = this->_tileYSize;
  uVar6 = (ulong)uVar1 * (ulong)uVar2;
  pRVar7 = (Rgba *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  pRVar3 = (this->_buf)._data;
  if (pRVar3 != (Rgba *)0x0) {
    operator_delete__(pRVar3);
  }
  (this->_buf)._sizeX = (ulong)uVar2;
  (this->_buf)._sizeY = (ulong)uVar1;
  (this->_buf)._data = pRVar7;
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  return;
}

Assistant:

TiledRgbaOutputFile::ToYa::ToYa (TiledOutputFile &outputFile,
				 RgbaChannels rgbaChannels)
:
    _outputFile (outputFile)
{
    _writeA = (rgbaChannels & WRITE_A)? true: false;
    
    const TileDescription &td = outputFile.header().tileDescription();

    _tileXSize = td.xSize;
    _tileYSize = td.ySize;
    _yw = ywFromHeader (_outputFile.header());
    _buf.resizeErase (_tileYSize, _tileXSize);
    _fbBase = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}